

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::FlattenRunEndsSwitch<short>
               (Vector *result,ArrowRunEndEncodingState *run_end_encoding,idx_t compressed_size,
               idx_t scan_offset,idx_t size)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  ulong *puVar1;
  undefined8 uVar2;
  PhysicalType PVar3;
  data_t dVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  data_ptr_t pdVar7;
  unsigned_long *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  long lVar11;
  sel_t *psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  type pVVar33;
  type pVVar34;
  TemplatedValidityData<unsigned_long> *pTVar35;
  _Head_base<0UL,_unsigned_long_*,_false> _Var36;
  NotImplementedException *this_01;
  ulong uVar37;
  ulong uVar38;
  PhysicalType type;
  data_ptr_t pdVar39;
  idx_t idx_in_entry_1;
  ulong uVar40;
  ulong uVar41;
  idx_t iVar42;
  idx_t iVar43;
  idx_t idx_in_entry;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  int iVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar92;
  int iVar93;
  int iVar98;
  undefined1 auVar94 [16];
  int iVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_XMM15 [16];
  UnifiedVectorFormat value_format;
  UnifiedVectorFormat run_end_format;
  undefined1 local_f8 [16];
  idx_t local_e8;
  UnifiedVectorFormat local_e0;
  undefined1 local_98 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  long lVar58;
  long lVar63;
  
  this = &run_end_encoding->values;
  pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
  PVar3 = (pVVar33->type).physical_type_;
  switch(PVar3) {
  case BOOL:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar37;
                uVar38 = uVar45;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar38 & 0x3f;
                  _Var36._M_head_impl[uVar38 >> 6] =
                       _Var36._M_head_impl[uVar38 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar38 = uVar38 + 1;
                  uVar40 = uVar40 - 1;
                } while (uVar40 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              dVar4 = local_e0.data[uVar40];
              uVar40 = uVar45;
              uVar38 = uVar37;
              do {
                pdVar7[uVar40] = dVar4;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar40 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar40 & 0x3f);
                }
                uVar40 = uVar40 + 1;
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        uVar37 = uVar44;
        if (lVar11 != 0) {
          uVar37 = (ulong)*(uint *)(lVar11 + uVar44 * 4);
        }
        uVar40 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          uVar40 = (ulong)psVar12[uVar44];
        }
        uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar38 < size - uVar45) {
          uVar37 = uVar38;
        }
        if (uVar37 != 0) {
          switchD_012e5a64::default(pdVar7 + uVar45,(uint)local_e0.data[uVar40],uVar37);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) &&
              (bVar46 = compressed_size - 1 != uVar44, uVar44 = uVar44 + 1, bVar46));
    }
    break;
  case UINT8:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            uVar38 = uVar37;
            uVar41 = uVar45;
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else {
              for (; uVar38 != 0; uVar38 = uVar38 - 1) {
                pdVar7[uVar41] = local_e0.data[uVar40];
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar41 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar41 & 0x3f);
                }
                uVar41 = uVar41 + 1;
              }
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      uVar45 = 0;
      do {
        uVar37 = uVar44;
        if (*(long *)local_98._0_8_ != 0) {
          uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
        }
        uVar40 = uVar44;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
        }
        uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar38 < size - uVar45) {
          uVar37 = uVar38;
        }
        if (uVar37 != 0) {
          switchD_012e5a64::default(pdVar7 + uVar45,(uint)local_e0.data[uVar40],uVar37);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) &&
              (bVar46 = compressed_size - 1 != uVar44, uVar44 = uVar44 + 1, bVar46));
    }
    break;
  case INT8:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            uVar38 = uVar37;
            uVar41 = uVar45;
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else {
              for (; uVar38 != 0; uVar38 = uVar38 - 1) {
                pdVar7[uVar41] = local_e0.data[uVar40];
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar41 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar41 & 0x3f);
                }
                uVar41 = uVar41 + 1;
              }
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      uVar45 = 0;
      do {
        uVar37 = uVar44;
        if (*(long *)local_98._0_8_ != 0) {
          uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
        }
        uVar40 = uVar44;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
        }
        uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar38 < size - uVar45) {
          uVar37 = uVar38;
        }
        if (uVar37 != 0) {
          switchD_012e5a64::default(pdVar7 + uVar45,(uint)local_e0.data[uVar40],uVar37);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) &&
              (bVar46 = compressed_size - 1 != uVar44, uVar44 = uVar44 + 1, bVar46));
    }
    break;
  case UINT16:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar54 = _DAT_01da0bd0;
    auVar62 = _DAT_01da0bc0;
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar5 = *(undefined2 *)(local_e0.data + uVar40 * 2);
              uVar40 = uVar45;
              uVar38 = uVar37;
              do {
                *(undefined2 *)(pdVar7 + uVar40 * 2) = uVar5;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar40 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar40 & 0x3f);
                }
                uVar40 = uVar40 + 1;
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar66 = extraout_XMM0_00;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = ((long)*(short *)(local_98._8_8_ + iVar42 * 2) - uVar45) - scan_offset;
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar5 = *(undefined2 *)(local_e0.data + iVar43 * 2);
          lVar58 = uVar37 - 1;
          auVar67._8_4_ = (int)lVar58;
          auVar67._0_8_ = lVar58;
          auVar67._12_4_ = (int)((ulong)lVar58 >> 0x20);
          lVar58 = uVar45 * 2;
          auVar67 = auVar67 ^ auVar31;
          uVar40 = 0;
          auVar71 = auVar30;
          auVar73 = auVar54;
          auVar75 = auVar62;
          auVar77 = _DAT_01da0bb0;
          do {
            auVar78 = auVar71 ^ auVar31;
            iVar93 = auVar67._0_4_;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            iVar49 = auVar67._4_4_;
            auVar87._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar99 = auVar67._8_4_;
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            iVar69 = auVar67._12_4_;
            auVar87._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar22._4_4_ = iVar92;
            auVar22._0_4_ = iVar92;
            auVar22._8_4_ = iVar98;
            auVar22._12_4_ = iVar98;
            auVar60 = pshuflw(in_XMM15,auVar22,0xe8);
            auVar86._4_4_ = -(uint)(auVar78._4_4_ == iVar49);
            auVar86._12_4_ = -(uint)(auVar78._12_4_ == iVar69);
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar66 = pshuflw(auVar66,auVar86,0xe8);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar78 = pshuflw(auVar60,auVar87,0xe8);
            auVar66 = (auVar78 | auVar66 & auVar60) ^ auVar55;
            auVar66 = packssdw(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58) = uVar5;
            }
            auVar23._4_4_ = iVar92;
            auVar23._0_4_ = iVar92;
            auVar23._8_4_ = iVar98;
            auVar23._12_4_ = iVar98;
            auVar87 = auVar86 & auVar23 | auVar87;
            auVar78 = packssdw(auVar87,auVar87);
            auVar78 = packssdw(auVar78 ^ auVar55,auVar78 ^ auVar55);
            if ((auVar78._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 2) = uVar5;
            }
            auVar78 = auVar73 ^ auVar31;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            auVar96._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            auVar96._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar88._4_4_ = iVar92;
            auVar88._0_4_ = iVar92;
            auVar88._8_4_ = iVar98;
            auVar88._12_4_ = iVar98;
            iVar92 = -(uint)(auVar78._4_4_ == iVar49);
            iVar98 = -(uint)(auVar78._12_4_ == iVar69);
            auVar24._4_4_ = iVar92;
            auVar24._0_4_ = iVar92;
            auVar24._8_4_ = iVar98;
            auVar24._12_4_ = iVar98;
            auVar96._0_4_ = auVar96._4_4_;
            auVar96._8_4_ = auVar96._12_4_;
            auVar78 = auVar24 & auVar88 | auVar96;
            auVar78 = packssdw(auVar78,auVar78);
            auVar78 = packssdw(auVar78 ^ auVar55,auVar78 ^ auVar55);
            if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 4) = uVar5;
            }
            auVar78 = pshufhw(auVar78,auVar88,0x84);
            auVar25._4_4_ = iVar92;
            auVar25._0_4_ = iVar92;
            auVar25._8_4_ = iVar98;
            auVar25._12_4_ = iVar98;
            auVar82 = pshufhw(auVar88,auVar25,0x84);
            auVar60 = pshufhw(auVar78,auVar96,0x84);
            auVar78 = (auVar60 | auVar82 & auVar78) ^ auVar55;
            auVar78 = packssdw(auVar78,auVar78);
            if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 6) = uVar5;
            }
            auVar78 = auVar75 ^ auVar31;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            auVar90._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            auVar90._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar26._4_4_ = iVar92;
            auVar26._0_4_ = iVar92;
            auVar26._8_4_ = iVar98;
            auVar26._12_4_ = iVar98;
            auVar60 = pshuflw(auVar66,auVar26,0xe8);
            auVar48._0_4_ = -(uint)(auVar78._0_4_ == iVar93);
            auVar48._4_4_ = -(uint)(auVar78._4_4_ == iVar49);
            auVar48._8_4_ = -(uint)(auVar78._8_4_ == iVar99);
            auVar48._12_4_ = -(uint)(auVar78._12_4_ == iVar69);
            auVar89._4_4_ = auVar48._4_4_;
            auVar89._0_4_ = auVar48._4_4_;
            auVar89._8_4_ = auVar48._12_4_;
            auVar89._12_4_ = auVar48._12_4_;
            auVar66 = pshuflw(auVar48,auVar89,0xe8);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar78 = pshuflw(auVar60,auVar90,0xe8);
            in_XMM15 = (auVar78 | auVar66 & auVar60) ^ auVar55;
            auVar66 = packssdw(auVar66 & auVar60,in_XMM15);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 8) = uVar5;
            }
            auVar27._4_4_ = iVar92;
            auVar27._0_4_ = iVar92;
            auVar27._8_4_ = iVar98;
            auVar27._12_4_ = iVar98;
            auVar90 = auVar89 & auVar27 | auVar90;
            auVar78 = packssdw(auVar90,auVar90);
            auVar66 = packssdw(auVar66,auVar78 ^ auVar55);
            if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 10) = uVar5;
            }
            auVar66 = auVar77 ^ auVar31;
            iVar93 = -(uint)(iVar93 < auVar66._0_4_);
            auVar97._4_4_ = -(uint)(iVar49 < auVar66._4_4_);
            iVar99 = -(uint)(iVar99 < auVar66._8_4_);
            auVar97._12_4_ = -(uint)(iVar69 < auVar66._12_4_);
            auVar91._4_4_ = iVar93;
            auVar91._0_4_ = iVar93;
            auVar91._8_4_ = iVar99;
            auVar91._12_4_ = iVar99;
            iVar93 = -(uint)(auVar66._4_4_ == iVar49);
            iVar49 = -(uint)(auVar66._12_4_ == iVar69);
            auVar28._4_4_ = iVar93;
            auVar28._0_4_ = iVar93;
            auVar28._8_4_ = iVar49;
            auVar28._12_4_ = iVar49;
            auVar97._0_4_ = auVar97._4_4_;
            auVar97._8_4_ = auVar97._12_4_;
            auVar66 = auVar28 & auVar91 | auVar97;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packssdw(auVar66 ^ auVar55,auVar66 ^ auVar55);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 0xc) = uVar5;
            }
            auVar66 = pshufhw(auVar66,auVar91,0x84);
            auVar29._4_4_ = iVar93;
            auVar29._0_4_ = iVar93;
            auVar29._8_4_ = iVar49;
            auVar29._12_4_ = iVar49;
            auVar60 = pshufhw(auVar91,auVar29,0x84);
            auVar78 = pshufhw(auVar66,auVar97,0x84);
            auVar66 = (auVar78 | auVar60 & auVar66) ^ auVar55;
            auVar66 = packssdw(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 0xe) = uVar5;
            }
            uVar40 = uVar40 + 8;
            lVar63 = auVar71._8_8_;
            auVar71._0_8_ = auVar71._0_8_ + 8;
            auVar71._8_8_ = lVar63 + 8;
            lVar63 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + 8;
            auVar73._8_8_ = lVar63 + 8;
            lVar63 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 8;
            auVar75._8_8_ = lVar63 + 8;
            lVar63 = auVar77._8_8_;
            auVar77._0_8_ = auVar77._0_8_ + 8;
            auVar77._8_8_ = lVar63 + 8;
          } while ((uVar37 + 7 & 0xfffffffffffffff8) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case INT16:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar54 = _DAT_01da0bd0;
    auVar62 = _DAT_01da0bc0;
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar5 = *(undefined2 *)(local_e0.data + uVar40 * 2);
              uVar40 = uVar45;
              uVar38 = uVar37;
              do {
                *(undefined2 *)(pdVar7 + uVar40 * 2) = uVar5;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar40 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar40 & 0x3f);
                }
                uVar40 = uVar40 + 1;
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar66 = extraout_XMM0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = ((long)*(short *)(local_98._8_8_ + iVar42 * 2) - uVar45) - scan_offset;
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar5 = *(undefined2 *)(local_e0.data + iVar43 * 2);
          lVar58 = uVar37 - 1;
          auVar64._8_4_ = (int)lVar58;
          auVar64._0_8_ = lVar58;
          auVar64._12_4_ = (int)((ulong)lVar58 >> 0x20);
          lVar58 = uVar45 * 2;
          auVar64 = auVar64 ^ auVar31;
          uVar40 = 0;
          auVar70 = auVar30;
          auVar72 = auVar54;
          auVar74 = auVar62;
          auVar76 = _DAT_01da0bb0;
          do {
            auVar78 = auVar70 ^ auVar31;
            iVar93 = auVar64._0_4_;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            iVar49 = auVar64._4_4_;
            auVar80._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar99 = auVar64._8_4_;
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            iVar69 = auVar64._12_4_;
            auVar80._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar14._4_4_ = iVar92;
            auVar14._0_4_ = iVar92;
            auVar14._8_4_ = iVar98;
            auVar14._12_4_ = iVar98;
            auVar60 = pshuflw(in_XMM15,auVar14,0xe8);
            auVar79._4_4_ = -(uint)(auVar78._4_4_ == iVar49);
            auVar79._12_4_ = -(uint)(auVar78._12_4_ == iVar69);
            auVar79._0_4_ = auVar79._4_4_;
            auVar79._8_4_ = auVar79._12_4_;
            auVar66 = pshuflw(auVar66,auVar79,0xe8);
            auVar80._0_4_ = auVar80._4_4_;
            auVar80._8_4_ = auVar80._12_4_;
            auVar78 = pshuflw(auVar60,auVar80,0xe8);
            auVar66 = (auVar78 | auVar66 & auVar60) ^ auVar52;
            auVar66 = packssdw(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58) = uVar5;
            }
            auVar15._4_4_ = iVar92;
            auVar15._0_4_ = iVar92;
            auVar15._8_4_ = iVar98;
            auVar15._12_4_ = iVar98;
            auVar80 = auVar79 & auVar15 | auVar80;
            auVar78 = packssdw(auVar80,auVar80);
            auVar78 = packssdw(auVar78 ^ auVar52,auVar78 ^ auVar52);
            if ((auVar78._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 2) = uVar5;
            }
            auVar78 = auVar72 ^ auVar31;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            auVar94._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            auVar94._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar81._4_4_ = iVar92;
            auVar81._0_4_ = iVar92;
            auVar81._8_4_ = iVar98;
            auVar81._12_4_ = iVar98;
            iVar92 = -(uint)(auVar78._4_4_ == iVar49);
            iVar98 = -(uint)(auVar78._12_4_ == iVar69);
            auVar16._4_4_ = iVar92;
            auVar16._0_4_ = iVar92;
            auVar16._8_4_ = iVar98;
            auVar16._12_4_ = iVar98;
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar78 = auVar16 & auVar81 | auVar94;
            auVar78 = packssdw(auVar78,auVar78);
            auVar78 = packssdw(auVar78 ^ auVar52,auVar78 ^ auVar52);
            if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 4) = uVar5;
            }
            auVar78 = pshufhw(auVar78,auVar81,0x84);
            auVar17._4_4_ = iVar92;
            auVar17._0_4_ = iVar92;
            auVar17._8_4_ = iVar98;
            auVar17._12_4_ = iVar98;
            auVar82 = pshufhw(auVar81,auVar17,0x84);
            auVar60 = pshufhw(auVar78,auVar94,0x84);
            auVar78 = (auVar60 | auVar82 & auVar78) ^ auVar52;
            auVar78 = packssdw(auVar78,auVar78);
            if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 6) = uVar5;
            }
            auVar78 = auVar74 ^ auVar31;
            iVar92 = -(uint)(iVar93 < auVar78._0_4_);
            auVar84._4_4_ = -(uint)(iVar49 < auVar78._4_4_);
            iVar98 = -(uint)(iVar99 < auVar78._8_4_);
            auVar84._12_4_ = -(uint)(iVar69 < auVar78._12_4_);
            auVar18._4_4_ = iVar92;
            auVar18._0_4_ = iVar92;
            auVar18._8_4_ = iVar98;
            auVar18._12_4_ = iVar98;
            auVar60 = pshuflw(auVar66,auVar18,0xe8);
            auVar47._0_4_ = -(uint)(auVar78._0_4_ == iVar93);
            auVar47._4_4_ = -(uint)(auVar78._4_4_ == iVar49);
            auVar47._8_4_ = -(uint)(auVar78._8_4_ == iVar99);
            auVar47._12_4_ = -(uint)(auVar78._12_4_ == iVar69);
            auVar83._4_4_ = auVar47._4_4_;
            auVar83._0_4_ = auVar47._4_4_;
            auVar83._8_4_ = auVar47._12_4_;
            auVar83._12_4_ = auVar47._12_4_;
            auVar66 = pshuflw(auVar47,auVar83,0xe8);
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar78 = pshuflw(auVar60,auVar84,0xe8);
            in_XMM15 = (auVar78 | auVar66 & auVar60) ^ auVar52;
            auVar66 = packssdw(auVar66 & auVar60,in_XMM15);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 8) = uVar5;
            }
            auVar19._4_4_ = iVar92;
            auVar19._0_4_ = iVar92;
            auVar19._8_4_ = iVar98;
            auVar19._12_4_ = iVar98;
            auVar84 = auVar83 & auVar19 | auVar84;
            auVar78 = packssdw(auVar84,auVar84);
            auVar66 = packssdw(auVar66,auVar78 ^ auVar52);
            if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 10) = uVar5;
            }
            auVar66 = auVar76 ^ auVar31;
            iVar93 = -(uint)(iVar93 < auVar66._0_4_);
            auVar95._4_4_ = -(uint)(iVar49 < auVar66._4_4_);
            iVar99 = -(uint)(iVar99 < auVar66._8_4_);
            auVar95._12_4_ = -(uint)(iVar69 < auVar66._12_4_);
            auVar85._4_4_ = iVar93;
            auVar85._0_4_ = iVar93;
            auVar85._8_4_ = iVar99;
            auVar85._12_4_ = iVar99;
            iVar93 = -(uint)(auVar66._4_4_ == iVar49);
            iVar49 = -(uint)(auVar66._12_4_ == iVar69);
            auVar20._4_4_ = iVar93;
            auVar20._0_4_ = iVar93;
            auVar20._8_4_ = iVar49;
            auVar20._12_4_ = iVar49;
            auVar95._0_4_ = auVar95._4_4_;
            auVar95._8_4_ = auVar95._12_4_;
            auVar66 = auVar20 & auVar85 | auVar95;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packssdw(auVar66 ^ auVar52,auVar66 ^ auVar52);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 0xc) = uVar5;
            }
            auVar66 = pshufhw(auVar66,auVar85,0x84);
            auVar21._4_4_ = iVar93;
            auVar21._0_4_ = iVar93;
            auVar21._8_4_ = iVar49;
            auVar21._12_4_ = iVar49;
            auVar60 = pshufhw(auVar85,auVar21,0x84);
            auVar78 = pshufhw(auVar66,auVar95,0x84);
            auVar66 = (auVar78 | auVar60 & auVar66) ^ auVar52;
            auVar66 = packssdw(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar7 + uVar40 * 2 + lVar58 + 0xe) = uVar5;
            }
            uVar40 = uVar40 + 8;
            lVar63 = auVar70._8_8_;
            auVar70._0_8_ = auVar70._0_8_ + 8;
            auVar70._8_8_ = lVar63 + 8;
            lVar63 = auVar72._8_8_;
            auVar72._0_8_ = auVar72._0_8_ + 8;
            auVar72._8_8_ = lVar63 + 8;
            lVar63 = auVar74._8_8_;
            auVar74._0_8_ = auVar74._0_8_ + 8;
            auVar74._8_8_ = lVar63 + 8;
            lVar63 = auVar76._8_8_;
            auVar76._0_8_ = auVar76._0_8_ + 8;
            auVar76._8_8_ = lVar63 + 8;
          } while ((uVar37 + 7 & 0xfffffffffffffff8) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case UINT32:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar62 = _DAT_01da0bd0;
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar6 = *(undefined4 *)(local_e0.data + uVar40 * 4);
              uVar40 = uVar45;
              uVar38 = uVar37;
              do {
                *(undefined4 *)(pdVar7 + uVar40 * 4) = uVar6;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar40 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar40 & 0x3f);
                }
                uVar40 = uVar40 + 1;
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = (long)*(short *)(local_98._8_8_ + iVar42 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar6 = *(undefined4 *)(local_e0.data + iVar43 * 4);
          lVar58 = uVar37 - 1;
          auVar53._8_4_ = (int)lVar58;
          auVar53._0_8_ = lVar58;
          auVar53._12_4_ = (int)((ulong)lVar58 >> 0x20);
          lVar58 = uVar45 * 4;
          auVar53 = auVar53 ^ auVar31;
          uVar40 = 0;
          auVar59 = auVar30;
          auVar65 = auVar62;
          do {
            auVar54 = auVar59 ^ auVar31;
            iVar93 = auVar53._4_4_;
            if ((bool)(~(auVar54._4_4_ == iVar93 && auVar53._0_4_ < auVar54._0_4_ ||
                        iVar93 < auVar54._4_4_) & 1)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58) = uVar6;
            }
            if ((auVar54._12_4_ != auVar53._12_4_ || auVar54._8_4_ <= auVar53._8_4_) &&
                auVar54._12_4_ <= auVar53._12_4_) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 4) = uVar6;
            }
            iVar49 = SUB164(auVar65 ^ auVar31,4);
            if (iVar49 <= iVar93 &&
                (iVar49 != iVar93 || SUB164(auVar65 ^ auVar31,0) <= auVar53._0_4_)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 8) = uVar6;
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 0xc) = uVar6;
            }
            uVar40 = uVar40 + 4;
            lVar63 = auVar59._8_8_;
            auVar59._0_8_ = auVar59._0_8_ + 4;
            auVar59._8_8_ = lVar63 + 4;
            lVar63 = auVar65._8_8_;
            auVar65._0_8_ = auVar65._0_8_ + 4;
            auVar65._8_8_ = lVar63 + 4;
          } while ((uVar37 + 3 & 0xfffffffffffffffc) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case INT32:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar62 = _DAT_01da0bd0;
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar6 = *(undefined4 *)(local_e0.data + uVar40 * 4);
              uVar40 = uVar45;
              uVar38 = uVar37;
              do {
                *(undefined4 *)(pdVar7 + uVar40 * 4) = uVar6;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar40 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar40 & 0x3f);
                }
                uVar40 = uVar40 + 1;
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = (long)*(short *)(local_98._8_8_ + iVar42 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar6 = *(undefined4 *)(local_e0.data + iVar43 * 4);
          lVar58 = uVar37 - 1;
          auVar56._8_4_ = (int)lVar58;
          auVar56._0_8_ = lVar58;
          auVar56._12_4_ = (int)((ulong)lVar58 >> 0x20);
          lVar58 = uVar45 * 4;
          auVar56 = auVar56 ^ auVar31;
          uVar40 = 0;
          auVar61 = auVar30;
          auVar68 = auVar62;
          do {
            auVar54 = auVar61 ^ auVar31;
            iVar93 = auVar56._4_4_;
            if ((bool)(~(auVar54._4_4_ == iVar93 && auVar56._0_4_ < auVar54._0_4_ ||
                        iVar93 < auVar54._4_4_) & 1)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58) = uVar6;
            }
            if ((auVar54._12_4_ != auVar56._12_4_ || auVar54._8_4_ <= auVar56._8_4_) &&
                auVar54._12_4_ <= auVar56._12_4_) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 4) = uVar6;
            }
            iVar49 = SUB164(auVar68 ^ auVar31,4);
            if (iVar49 <= iVar93 &&
                (iVar49 != iVar93 || SUB164(auVar68 ^ auVar31,0) <= auVar56._0_4_)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 8) = uVar6;
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 0xc) = uVar6;
            }
            uVar40 = uVar40 + 4;
            lVar63 = auVar61._8_8_;
            auVar61._0_8_ = auVar61._0_8_ + 4;
            auVar61._8_8_ = lVar63 + 4;
            lVar63 = auVar68._8_8_;
            auVar68._0_8_ = auVar68._0_8_ + 4;
            auVar68._8_8_ = lVar63 + 4;
          } while ((uVar37 + 3 & 0xfffffffffffffffc) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case UINT64:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar38 = uVar45;
              uVar41 = uVar37;
              do {
                *(undefined8 *)(pdVar7 + uVar38 * 8) = *(undefined8 *)(local_e0.data + uVar40 * 8);
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar38 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                }
                uVar38 = uVar38 + 1;
                uVar41 = uVar41 - 1;
              } while (uVar41 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = ((long)*(short *)(local_98._8_8_ + iVar42 * 2) - uVar45) - scan_offset;
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar2 = *(undefined8 *)(local_e0.data + iVar43 * 8);
          lVar58 = uVar37 - 1;
          auVar50._8_4_ = (int)lVar58;
          auVar50._0_8_ = lVar58;
          auVar50._12_4_ = (int)((ulong)lVar58 >> 0x20);
          auVar50 = auVar50 ^ auVar31;
          uVar40 = 0;
          auVar57 = auVar30;
          do {
            auVar62 = auVar57 ^ auVar31;
            if ((bool)(~(auVar50._4_4_ < auVar62._4_4_ ||
                        auVar50._0_4_ < auVar62._0_4_ && auVar62._4_4_ == auVar50._4_4_) & 1)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8) = uVar2;
            }
            if (auVar62._12_4_ <= auVar50._12_4_ &&
                (auVar62._8_4_ <= auVar50._8_4_ || auVar62._12_4_ != auVar50._12_4_)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8 + 8) = uVar2;
            }
            uVar40 = uVar40 + 2;
            lVar58 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 2;
            auVar57._8_8_ = lVar58 + 2;
          } while ((uVar37 + 1 & 0xfffffffffffffffe) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case INT64:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar38 = uVar45;
              uVar41 = uVar37;
              do {
                *(undefined8 *)(pdVar7 + uVar38 * 8) = *(undefined8 *)(local_e0.data + uVar40 * 8);
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar38 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                }
                uVar38 = uVar38 + 1;
                uVar41 = uVar41 - 1;
              } while (uVar41 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = ((long)*(short *)(local_98._8_8_ + iVar42 * 2) - uVar45) - scan_offset;
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar2 = *(undefined8 *)(local_e0.data + iVar43 * 8);
          lVar58 = uVar37 - 1;
          auVar51._8_4_ = (int)lVar58;
          auVar51._0_8_ = lVar58;
          auVar51._12_4_ = (int)((ulong)lVar58 >> 0x20);
          auVar51 = auVar51 ^ auVar31;
          uVar40 = 0;
          auVar82 = auVar30;
          do {
            auVar62 = auVar82 ^ auVar31;
            if ((bool)(~(auVar51._4_4_ < auVar62._4_4_ ||
                        auVar51._0_4_ < auVar62._0_4_ && auVar62._4_4_ == auVar51._4_4_) & 1)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8) = uVar2;
            }
            if (auVar62._12_4_ <= auVar51._12_4_ &&
                (auVar62._8_4_ <= auVar51._8_4_ || auVar62._12_4_ != auVar51._12_4_)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8 + 8) = uVar2;
            }
            uVar40 = uVar40 + 2;
            lVar58 = auVar82._8_8_;
            auVar82._0_8_ = auVar82._0_8_ + 2;
            auVar82._8_8_ = lVar58 + 2;
          } while ((uVar37 + 1 & 0xfffffffffffffffe) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case FLOAT:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar62 = _DAT_01da0bd0;
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar6 = *(undefined4 *)(local_e0.data + uVar40 * 4);
              uVar40 = uVar37;
              uVar38 = uVar45;
              do {
                *(undefined4 *)(pdVar7 + uVar38 * 4) = uVar6;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar38 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                }
                uVar38 = uVar38 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = (long)*(short *)(local_98._8_8_ + iVar42 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar6 = *(undefined4 *)(local_e0.data + iVar43 * 4);
          lVar58 = uVar37 - 1;
          auVar60._8_4_ = (int)lVar58;
          auVar60._0_8_ = lVar58;
          auVar60._12_4_ = (int)((ulong)lVar58 >> 0x20);
          lVar58 = uVar45 * 4;
          auVar60 = auVar60 ^ auVar31;
          uVar40 = 0;
          auVar66 = auVar30;
          auVar78 = auVar62;
          do {
            auVar54 = auVar66 ^ auVar31;
            iVar93 = auVar60._4_4_;
            if ((bool)(~(auVar54._4_4_ == iVar93 && auVar60._0_4_ < auVar54._0_4_ ||
                        iVar93 < auVar54._4_4_) & 1)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58) = uVar6;
            }
            if ((auVar54._12_4_ != auVar60._12_4_ || auVar54._8_4_ <= auVar60._8_4_) &&
                auVar54._12_4_ <= auVar60._12_4_) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 4) = uVar6;
            }
            iVar49 = SUB164(auVar78 ^ auVar31,4);
            if (iVar49 <= iVar93 &&
                (iVar49 != iVar93 || SUB164(auVar78 ^ auVar31,0) <= auVar60._0_4_)) {
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 8) = uVar6;
              *(undefined4 *)(pdVar7 + uVar40 * 4 + lVar58 + 0xc) = uVar6;
            }
            uVar40 = uVar40 + 4;
            lVar63 = auVar66._8_8_;
            auVar66._0_8_ = auVar66._0_8_ + 4;
            auVar66._8_8_ = lVar63 + 4;
            lVar63 = auVar78._8_8_;
            auVar78._0_8_ = auVar78._0_8_ + 4;
            auVar78._8_8_ = lVar63 + 4;
          } while ((uVar37 + 3 & 0xfffffffffffffffc) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case DOUBLE:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    auVar31 = _DAT_01d9fb10;
    auVar30 = _DAT_01d9fb00;
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = ((long)*(short *)(local_98._8_8_ + uVar37 * 2) - uVar45) - scan_offset;
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 8);
              uVar40 = uVar37;
              uVar38 = uVar45;
              do {
                *(undefined8 *)(pdVar7 + uVar38 * 8) = uVar2;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar38 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                }
                uVar38 = uVar38 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      lVar11 = *(long *)local_98._0_8_;
      psVar12 = (local_e0.sel)->sel_vector;
      uVar45 = 0;
      do {
        iVar42 = uVar44;
        if (lVar11 != 0) {
          iVar42 = (idx_t)*(uint *)(lVar11 + uVar44 * 4);
        }
        iVar43 = uVar44;
        if (psVar12 != (sel_t *)0x0) {
          iVar43 = (idx_t)psVar12[uVar44];
        }
        uVar40 = ((long)*(short *)(local_98._8_8_ + iVar42 * 2) - uVar45) - scan_offset;
        uVar37 = size - uVar45;
        if (uVar40 < size - uVar45) {
          uVar37 = uVar40;
        }
        if (uVar37 != 0) {
          uVar2 = *(undefined8 *)(local_e0.data + iVar43 * 8);
          lVar58 = uVar37 - 1;
          auVar54._8_4_ = (int)lVar58;
          auVar54._0_8_ = lVar58;
          auVar54._12_4_ = (int)((ulong)lVar58 >> 0x20);
          auVar54 = auVar54 ^ auVar31;
          uVar40 = 0;
          auVar62 = auVar30;
          do {
            auVar66 = auVar62 ^ auVar31;
            if ((bool)(~(auVar54._4_4_ < auVar66._4_4_ ||
                        auVar54._0_4_ < auVar66._0_4_ && auVar66._4_4_ == auVar54._4_4_) & 1)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8) = uVar2;
            }
            if (auVar66._12_4_ <= auVar54._12_4_ &&
                (auVar66._8_4_ <= auVar54._8_4_ || auVar66._12_4_ != auVar54._12_4_)) {
              *(undefined8 *)(pdVar7 + uVar40 * 8 + uVar45 * 8 + 8) = uVar2;
            }
            uVar40 = uVar40 + 2;
            lVar58 = auVar62._8_8_;
            auVar62._0_8_ = auVar62._0_8_ + 2;
            auVar62._8_8_ = lVar58 + 2;
          } while ((uVar37 + 1 & 0xfffffffffffffffe) != uVar40);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  case INTERVAL:
    pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) break;
      uVar44 = 0;
    }
    else {
      uVar45 = compressed_size;
      uVar37 = 0;
      do {
        uVar40 = uVar45 + uVar37 >> 1;
        uVar44 = uVar40 + 1;
        if (scan_offset <
            (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
          uVar44 = uVar37;
          uVar45 = uVar40;
        }
        uVar37 = uVar44;
      } while (uVar44 < uVar45);
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (uVar44 < compressed_size) {
          uVar45 = 0;
          do {
            uVar37 = uVar44;
            if (*(long *)local_98._0_8_ != 0) {
              uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
            }
            uVar40 = uVar44;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
            }
            uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
            uVar37 = size - uVar45;
            if (uVar38 < size - uVar45) {
              uVar37 = uVar38;
            }
            if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
              if (uVar37 != 0) {
                _Var36._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                uVar40 = uVar45;
                uVar38 = uVar37;
                do {
                  if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                    local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_f8,&local_e8);
                    uVar2 = local_f8._0_8_;
                    uVar32 = local_f8._8_8_;
                    local_f8 = (undefined1  [16])0x0;
                    p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                      }
                    }
                    pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(result->validity).
                                          super_TemplatedValidityMask<unsigned_long>.validity_data);
                    _Var36._M_head_impl =
                         (pTVar35->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var36._M_head_impl;
                  }
                  bVar13 = (byte)uVar40 & 0x3f;
                  _Var36._M_head_impl[uVar40 >> 6] =
                       _Var36._M_head_impl[uVar40 >> 6] &
                       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                  uVar40 = uVar40 + 1;
                  uVar38 = uVar38 - 1;
                } while (uVar38 != 0);
              }
            }
            else if (uVar37 != 0) {
              pdVar39 = pdVar7 + uVar45 * 0x10;
              uVar38 = uVar45;
              uVar41 = uVar37;
              do {
                uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
                *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
                *(undefined8 *)(pdVar39 + 8) = uVar2;
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 != (unsigned_long *)0x0) {
                  puVar1 = puVar8 + (uVar38 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                }
                uVar38 = uVar38 + 1;
                pdVar39 = pdVar39 + 0x10;
                uVar41 = uVar41 - 1;
              } while (uVar41 != 0);
            }
            uVar45 = uVar45 + uVar37;
          } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
        }
        break;
      }
    }
    if (uVar44 < compressed_size) {
      uVar45 = 0;
      do {
        uVar37 = uVar44;
        if (*(long *)local_98._0_8_ != 0) {
          uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
        }
        uVar40 = uVar44;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
        }
        uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
        uVar37 = size - uVar45;
        if (uVar38 < size - uVar45) {
          uVar37 = uVar38;
        }
        if (uVar37 != 0) {
          pdVar39 = pdVar7 + uVar45 * 0x10;
          uVar38 = uVar37;
          do {
            uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
            *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
            *(undefined8 *)(pdVar39 + 8) = uVar2;
            pdVar39 = pdVar39 + 0x10;
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        uVar45 = uVar45 + uVar37;
      } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
    }
    break;
  default:
    if (PVar3 == VARCHAR) {
      peVar10 = (pVVar33->auxiliary).internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var9 = (pVVar33->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      (result->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
      this_00 = (result->auxiliary).internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (result->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var9;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (&run_end_encoding->run_ends);
      pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
      Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (compressed_size == 0) {
        if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) break;
        uVar44 = 0;
      }
      else {
        uVar45 = compressed_size;
        uVar37 = 0;
        do {
          uVar40 = uVar45 + uVar37 >> 1;
          uVar44 = uVar40 + 1;
          if (scan_offset <
              (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
            uVar44 = uVar37;
            uVar45 = uVar40;
          }
          uVar37 = uVar44;
        } while (uVar44 < uVar45);
        if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (uVar44 < compressed_size) {
            uVar45 = 0;
            do {
              uVar37 = uVar44;
              if (*(long *)local_98._0_8_ != 0) {
                uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
              }
              uVar40 = uVar44;
              if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
                uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
              }
              uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
              uVar37 = size - uVar45;
              if (uVar38 < size - uVar45) {
                uVar37 = uVar38;
              }
              if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
                if (uVar37 != 0) {
                  _Var36._M_head_impl =
                       (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                  uVar40 = uVar45;
                  uVar38 = uVar37;
                  do {
                    if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                      local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_f8,&local_e8);
                      uVar2 = local_f8._0_8_;
                      uVar32 = local_f8._8_8_;
                      local_f8 = (undefined1  [16])0x0;
                      p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)uVar2;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)
                          ;
                        }
                      }
                      pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(&(result->validity).
                                            super_TemplatedValidityMask<unsigned_long>.validity_data
                                          );
                      _Var36._M_head_impl =
                           (pTVar35->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           _Var36._M_head_impl;
                    }
                    bVar13 = (byte)uVar40 & 0x3f;
                    _Var36._M_head_impl[uVar40 >> 6] =
                         _Var36._M_head_impl[uVar40 >> 6] &
                         (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                    uVar40 = uVar40 + 1;
                    uVar38 = uVar38 - 1;
                  } while (uVar38 != 0);
                }
              }
              else if (uVar37 != 0) {
                pdVar39 = pdVar7 + uVar45 * 0x10;
                uVar38 = uVar45;
                uVar41 = uVar37;
                do {
                  uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
                  *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
                  *(undefined8 *)(pdVar39 + 8) = uVar2;
                  puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar8 != (unsigned_long *)0x0) {
                    puVar1 = puVar8 + (uVar38 >> 6);
                    *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                  }
                  uVar38 = uVar38 + 1;
                  pdVar39 = pdVar39 + 0x10;
                  uVar41 = uVar41 - 1;
                } while (uVar41 != 0);
              }
              uVar45 = uVar45 + uVar37;
            } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
          }
          break;
        }
      }
      if (uVar44 < compressed_size) {
        uVar45 = 0;
        do {
          uVar37 = uVar44;
          if (*(long *)local_98._0_8_ != 0) {
            uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
          }
          uVar40 = uVar44;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
          }
          uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
          uVar37 = size - uVar45;
          if (uVar38 < size - uVar45) {
            uVar37 = uVar38;
          }
          if (uVar37 != 0) {
            pdVar39 = pdVar7 + uVar45 * 0x10;
            uVar38 = uVar37;
            do {
              uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
              *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
              *(undefined8 *)(pdVar39 + 8) = uVar2;
              pdVar39 = pdVar39 + 0x10;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          uVar45 = uVar45 + uVar37;
        } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
      }
      break;
    }
    if (PVar3 == INT128) {
      pVVar33 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (&run_end_encoding->run_ends);
      pVVar34 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
      Vector::ToUnifiedFormat(pVVar33,compressed_size,(UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pVVar34,compressed_size,&local_e0);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (compressed_size == 0) {
        if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) break;
        uVar44 = 0;
      }
      else {
        uVar45 = compressed_size;
        uVar37 = 0;
        do {
          uVar40 = uVar45 + uVar37 >> 1;
          uVar44 = uVar40 + 1;
          if (scan_offset <
              (ulong)(long)*(short *)(local_98._8_8_ + (uVar45 + uVar37 & 0xfffffffffffffffe))) {
            uVar44 = uVar37;
            uVar45 = uVar40;
          }
          uVar37 = uVar44;
        } while (uVar44 < uVar45);
        if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (uVar44 < compressed_size) {
            uVar45 = 0;
            do {
              uVar37 = uVar44;
              if (*(long *)local_98._0_8_ != 0) {
                uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
              }
              uVar40 = uVar44;
              if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
                uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
              }
              uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
              uVar37 = size - uVar45;
              if (uVar38 < size - uVar45) {
                uVar37 = uVar38;
              }
              if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar40 >> 6] >> (uVar40 & 0x3f) & 1) == 0) {
                if (uVar37 != 0) {
                  _Var36._M_head_impl =
                       (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                  uVar40 = uVar45;
                  uVar38 = uVar37;
                  do {
                    if (_Var36._M_head_impl == (unsigned_long *)0x0) {
                      local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_f8,&local_e8);
                      uVar2 = local_f8._0_8_;
                      uVar32 = local_f8._8_8_;
                      local_f8 = (undefined1  [16])0x0;
                      p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)uVar2;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
                      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)
                          ;
                        }
                      }
                      pTVar35 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(&(result->validity).
                                            super_TemplatedValidityMask<unsigned_long>.validity_data
                                          );
                      _Var36._M_head_impl =
                           (pTVar35->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           _Var36._M_head_impl;
                    }
                    bVar13 = (byte)uVar40 & 0x3f;
                    _Var36._M_head_impl[uVar40 >> 6] =
                         _Var36._M_head_impl[uVar40 >> 6] &
                         (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
                    uVar40 = uVar40 + 1;
                    uVar38 = uVar38 - 1;
                  } while (uVar38 != 0);
                }
              }
              else if (uVar37 != 0) {
                pdVar39 = pdVar7 + uVar45 * 0x10;
                uVar38 = uVar45;
                uVar41 = uVar37;
                do {
                  uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
                  *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
                  *(undefined8 *)(pdVar39 + 8) = uVar2;
                  puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar8 != (unsigned_long *)0x0) {
                    puVar1 = puVar8 + (uVar38 >> 6);
                    *puVar1 = *puVar1 | 1L << ((byte)uVar38 & 0x3f);
                  }
                  uVar38 = uVar38 + 1;
                  pdVar39 = pdVar39 + 0x10;
                  uVar41 = uVar41 - 1;
                } while (uVar41 != 0);
              }
              uVar45 = uVar45 + uVar37;
            } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
          }
          break;
        }
      }
      if (uVar44 < compressed_size) {
        uVar45 = 0;
        do {
          uVar37 = uVar44;
          if (*(long *)local_98._0_8_ != 0) {
            uVar37 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar44 * 4);
          }
          uVar40 = uVar44;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar40 = (ulong)(local_e0.sel)->sel_vector[uVar44];
          }
          uVar38 = (long)*(short *)(local_98._8_8_ + uVar37 * 2) - (scan_offset + uVar45);
          uVar37 = size - uVar45;
          if (uVar38 < size - uVar45) {
            uVar37 = uVar38;
          }
          if (uVar37 != 0) {
            pdVar39 = pdVar7 + uVar45 * 0x10;
            uVar38 = uVar37;
            do {
              uVar2 = *(undefined8 *)(local_e0.data + uVar40 * 0x10 + 8);
              *(undefined8 *)pdVar39 = *(undefined8 *)(local_e0.data + uVar40 * 0x10);
              *(undefined8 *)(pdVar39 + 8) = uVar2;
              pdVar39 = pdVar39 + 0x10;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          uVar45 = uVar45 + uVar37;
        } while ((uVar45 < size) && (uVar44 = uVar44 + 1, uVar44 != compressed_size));
      }
      break;
    }
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98._0_8_ = local_98 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"RunEndEncoded value type \'%s\' not supported yet","");
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)PVar3,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_01,(string *)local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return;
}

Assistant:

static void FlattenRunEndsSwitch(Vector &result, ArrowRunEndEncodingState &run_end_encoding, idx_t compressed_size,
                                 idx_t scan_offset, idx_t size) {
	auto &values = *run_end_encoding.values;
	auto physical_type = values.GetType().InternalType();

	switch (physical_type) {
	case PhysicalType::INT8:
		FlattenRunEnds<RUN_END_TYPE, int8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT16:
		FlattenRunEnds<RUN_END_TYPE, int16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEnds<RUN_END_TYPE, int32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEnds<RUN_END_TYPE, int64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT128:
		FlattenRunEnds<RUN_END_TYPE, hugeint_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT8:
		FlattenRunEnds<RUN_END_TYPE, uint8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT16:
		FlattenRunEnds<RUN_END_TYPE, uint16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT32:
		FlattenRunEnds<RUN_END_TYPE, uint32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT64:
		FlattenRunEnds<RUN_END_TYPE, uint64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::BOOL:
		FlattenRunEnds<RUN_END_TYPE, bool>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::FLOAT:
		FlattenRunEnds<RUN_END_TYPE, float>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::DOUBLE:
		FlattenRunEnds<RUN_END_TYPE, double>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INTERVAL:
		FlattenRunEnds<RUN_END_TYPE, interval_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::VARCHAR: {
		// Share the string heap, we don't need to allocate new strings, we just reference the existing ones
		result.SetAuxiliary(values.GetAuxiliary());
		FlattenRunEnds<RUN_END_TYPE, string_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	}
	default:
		throw NotImplementedException("RunEndEncoded value type '%s' not supported yet", TypeIdToString(physical_type));
	}
}